

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O3

pointer_type
cppcms::impl::
mfunc_to_event_handler<cppcms::impl::cgi::http,std::shared_ptr<cppcms::impl::cgi::http>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
          (offset_in_http_to_subr f,shared_ptr<cppcms::impl::cgi::http> *s,
          callback<void_(const_std::error_code_&)> *p1)

{
  event_handler_binder_p1<void_(cppcms::impl::cgi::http::*)(const_std::error_code_&,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::http>,_booster::callback<void_(const_std::error_code_&)>_>
  *this;
  shared_ptr<cppcms::impl::cgi::http> *in_RCX;
  callback<void_(const_std::error_code_&)> *in_R8;
  shared_ptr<cppcms::impl::cgi::http> *local_38;
  callback<void_(const_std::error_code_&)> *local_30;
  
  local_38 = s;
  local_30 = p1;
  this = (event_handler_binder_p1<void_(cppcms::impl::cgi::http::*)(const_std::error_code_&,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::http>,_booster::callback<void_(const_std::error_code_&)>_>
          *)operator_new(0x38);
  event_handler_binder_p1<void_(cppcms::impl::cgi::http::*)(const_std::error_code_&,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::http>,_booster::callback<void_(const_std::error_code_&)>_>
  ::event_handler_binder_p1(this,(offset_in_http_to_subr *)&local_38,in_RCX,in_R8);
  *(event_handler_binder_p1<void_(cppcms::impl::cgi::http::*)(const_std::error_code_&,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::http>,_booster::callback<void_(const_std::error_code_&)>_>
    **)f = this;
  booster::atomic_counter::inc();
  return (pointer_type)(callable<void_(const_std::error_code_&)> *)f;
}

Assistant:

booster::aio::event_handler::pointer_type mfunc_to_event_handler(void (C::*f)(booster::system::error_code const &,P1),S s,P1in const &p1)
{
	return new event_handler_binder_p1<void (C::*)(booster::system::error_code const &,P1),S,P1in>(f,s,p1);
}